

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageInputsXrSetInputDeviceLocationEXT
                   (XrSession session,XrPath topLevelPath,XrPath inputSourcePath,XrSpace space,
                   XrPosef pose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  ValidateXrHandleResult VVar4;
  char *pcVar5;
  long lVar6;
  XrResult XVar7;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_268;
  string local_248;
  XrSpace local_228;
  XrSession local_220;
  string local_218;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  XrObjectType local_198 [28];
  ios_base local_128 [264];
  
  local_1f8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198[0] = XR_OBJECT_TYPE_SESSION;
  local_228 = space;
  local_220 = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_1f8,&local_220,local_198);
  VVar4 = VerifyXrSessionHandle(&local_220);
  if (VVar4 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar8 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,local_220);
    local_198[0] = XR_OBJECT_TYPE_SPACE;
    std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
    emplace_back<XrSpace_T*&,XrObjectType>
              ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
               &local_1f8,&local_228,local_198);
    VVar4 = VerifyXrSpaceHandle(&local_228);
    if (VVar4 == VALIDATE_XR_HANDLE_SUCCESS) {
      bVar3 = VerifyXrParent(XR_OBJECT_TYPE_SESSION,(uint64_t)local_220,XR_OBJECT_TYPE_SPACE,
                             (uint64_t)local_228,true);
      XVar7 = XR_SUCCESS;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"XrSession ",10);
        local_248._M_dataplus._M_p = (pointer)local_220;
        paVar1 = &local_268.field_2;
        local_268._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_268,'\x12');
        *local_268._M_dataplus._M_p = '0';
        local_268._M_dataplus._M_p[1] = 'x';
        pcVar5 = local_268._M_dataplus._M_p + (local_268._M_string_length - 1);
        lVar6 = 0;
        do {
          bVar2 = *(byte *)((long)&local_248._M_dataplus._M_p + lVar6);
          *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
          pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
          lVar6 = lVar6 + 1;
          pcVar5 = pcVar5 + -2;
        } while (lVar6 != 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,local_268._M_dataplus._M_p,local_268._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198," must be a parent to XrSpace ",0x1d);
        local_248._M_dataplus._M_p = (pointer)local_228;
        local_268._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_268,'\x12');
        *local_268._M_dataplus._M_p = '0';
        local_268._M_dataplus._M_p[1] = 'x';
        pcVar5 = local_268._M_dataplus._M_p + (local_268._M_string_length - 1);
        lVar6 = 0;
        do {
          bVar2 = *(byte *)((long)&local_248._M_dataplus._M_p + lVar6);
          *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
          pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
          lVar6 = lVar6 + 1;
          pcVar5 = pcVar5 + -2;
        } while (lVar6 != 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,local_268._M_dataplus._M_p,local_268._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"VUID-xrSetInputDeviceLocationEXT-space-parent","");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"xrSetInputDeviceLocationEXT","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_1e0,&local_1f8);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(pVar8.second,&local_268,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_248,
                            &local_1e0,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (local_1e0.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e0.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        std::ios_base::~ios_base(local_128);
        XVar7 = XR_ERROR_VALIDATION_FAILURE;
      }
      goto LAB_00238e87;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Invalid XrSpace handle \"space\" ",0x1f);
    local_248._M_dataplus._M_p = (pointer)local_228;
    paVar1 = &local_268.field_2;
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_268,'\x12');
    *local_268._M_dataplus._M_p = '0';
    local_268._M_dataplus._M_p[1] = 'x';
    pcVar5 = local_268._M_dataplus._M_p + (local_268._M_string_length - 1);
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)&local_248._M_dataplus._M_p + lVar6);
      *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar6 = lVar6 + 1;
      pcVar5 = pcVar5 + -2;
    } while (lVar6 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"VUID-xrSetInputDeviceLocationEXT-space-parameter","");
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"xrSetInputDeviceLocationEXT","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1c8,&local_1f8);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(pVar8.second,&local_268,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_248,
                        &local_1c8,&local_218);
    local_1b0.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1c8.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_1b0.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      local_1b0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_1c8.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1b0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1c8.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Invalid XrSession handle \"session\" ",0x23);
    local_248._M_dataplus._M_p = (pointer)local_220;
    paVar1 = &local_268.field_2;
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_268,'\x12');
    *local_268._M_dataplus._M_p = '0';
    local_268._M_dataplus._M_p[1] = 'x';
    pcVar5 = local_268._M_dataplus._M_p + (local_268._M_string_length - 1);
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)&local_248._M_dataplus._M_p + lVar6);
      *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar6 = lVar6 + 1;
      pcVar5 = pcVar5 + -2;
    } while (lVar6 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"VUID-xrSetInputDeviceLocationEXT-session-parameter","");
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"xrSetInputDeviceLocationEXT","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1b0,&local_1f8);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_268,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_248,&local_1b0,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1b0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  XVar7 = XR_ERROR_HANDLE_INVALID;
LAB_00238e87:
  if (local_1f8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar7;
}

Assistant:

XrResult GenValidUsageInputsXrSetInputDeviceLocationEXT(
XrSession session,
XrPath topLevelPath,
XrPath inputSourcePath,
XrSpace space,
XrPosef pose) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrSetInputDeviceLocationEXT-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        objects_info.emplace_back(space, XR_OBJECT_TYPE_SPACE);
        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&space);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"space\" ";
                oss << HandleToHexString(space);
                CoreValidLogMessage(gen_instance_info, "VUID-xrSetInputDeviceLocationEXT-space-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        // Verify that the handles share a common ancestry
        if (!VerifyXrParent(XR_OBJECT_TYPE_SESSION,  MakeHandleGeneric(session),
                    XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(space), true)) {
            std::ostringstream oss_error;
            oss_error << "XrSession " << HandleToHexString(session);
            oss_error << " must be a parent to XrSpace ";
            oss_error << HandleToHexString(space);
            CoreValidLogMessage(gen_instance_info, "VUID-xrSetInputDeviceLocationEXT-space-parent",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                objects_info, oss_error.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}